

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_diag.cc
# Opt level: O3

void __thiscall
ipx::KKTSolverDiag::_Solve
          (KKTSolverDiag *this,Vector *a,Vector *b,double tol,Vector *x,Vector *y,Info *info)

{
  NormalMatrix *this_00;
  DiagonalPrecond *this_01;
  ipxint *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Model *pMVar7;
  size_t sVar8;
  double *pdVar9;
  double *pdVar10;
  pointer piVar11;
  pointer piVar12;
  pointer pdVar13;
  double *pdVar14;
  double *pdVar15;
  Info *pIVar16;
  Int IVar17;
  size_t sVar18;
  uint uVar19;
  NormalMatrix *__timer;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar25;
  Vector rhs;
  ConjugateResiduals cr;
  Vector local_70;
  Vector *local_60;
  double local_58;
  Info *local_50;
  ConjugateResiduals local_48;
  
  pMVar7 = this->model_;
  uVar3 = pMVar7->num_rows_;
  iVar4 = pMVar7->num_cols_;
  lVar23 = (long)iVar4;
  sVar8 = b->_M_size;
  local_70._M_size = sVar8;
  local_60 = x;
  local_58 = tol;
  local_70._M_data = (double *)operator_new(sVar8 * 8);
  if (sVar8 != 0) {
    pdVar9 = b->_M_data;
    sVar18 = 0;
    do {
      local_70._M_data[sVar18] = -pdVar9[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar8 != sVar18);
  }
  uVar19 = uVar3 + iVar4;
  if (uVar19 != 0 && SCARRY4(uVar3,iVar4) == (int)uVar19 < 0) {
    pdVar9 = (this->W_)._M_data;
    pdVar10 = a->_M_data;
    piVar11 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = 0;
    do {
      iVar5 = piVar11[uVar20];
      lVar21 = (long)iVar5;
      iVar6 = piVar11[uVar20 + 1];
      if (iVar5 < iVar6) {
        dVar25 = pdVar9[uVar20];
        dVar2 = pdVar10[uVar20];
        piVar12 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar5 = piVar12[lVar21];
          local_70._M_data[iVar5] = pdVar13[lVar21] * dVar25 * dVar2 + local_70._M_data[iVar5];
          lVar21 = lVar21 + 1;
        } while (iVar6 != lVar21);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar19);
  }
  local_50 = info;
  if (y->_M_size != 0) {
    memset(y->_M_data,0,y->_M_size << 3);
  }
  this_00 = &this->normal_matrix_;
  NormalMatrix::reset_time(this_00);
  this_01 = &this->precond_;
  DiagonalPrecond::reset_time(this_01);
  ConjugateResiduals::ConjugateResiduals(&local_48,this->control_);
  pIVar16 = local_50;
  __timer = this_00;
  ConjugateResiduals::Solve
            (&local_48,&this_00->super_LinearOperator,&this_01->super_LinearOperator,&local_70,
             local_58,(this->resscale_)._M_data,this->maxiter_,y);
  IVar17 = ConjugateResiduals::errflag(&local_48);
  (pIVar16->super_ipx_info).errflag = IVar17;
  IVar17 = ConjugateResiduals::iter(&local_48);
  piVar1 = &(pIVar16->super_ipx_info).kktiter1;
  *piVar1 = *piVar1 + IVar17;
  ConjugateResiduals::time(&local_48,(time_t *)__timer);
  (pIVar16->super_ipx_info).time_cr1 = extraout_XMM0_Qa + (pIVar16->super_ipx_info).time_cr1;
  NormalMatrix::time(this_00,(time_t *)__timer);
  (pIVar16->super_ipx_info).time_cr1_AAt =
       extraout_XMM0_Qa_00 + (pIVar16->super_ipx_info).time_cr1_AAt;
  DiagonalPrecond::time(this_01,(time_t *)__timer);
  (pIVar16->super_ipx_info).time_cr1_pre =
       extraout_XMM0_Qa_01 + (pIVar16->super_ipx_info).time_cr1_pre;
  IVar17 = ConjugateResiduals::iter(&local_48);
  this->iter_ = this->iter_ + IVar17;
  if (0 < (int)uVar3) {
    pdVar9 = b->_M_data;
    pdVar10 = local_60->_M_data;
    uVar20 = 0;
    do {
      pdVar10[lVar23 + uVar20] = pdVar9[uVar20];
      uVar20 = uVar20 + 1;
    } while (uVar3 != uVar20);
  }
  if (0 < iVar4) {
    piVar11 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar9 = y->_M_data;
    pdVar10 = (this->W_)._M_data;
    pdVar14 = a->_M_data;
    pdVar15 = local_60->_M_data;
    lVar21 = 0;
    do {
      iVar4 = piVar11[lVar21];
      lVar22 = (long)iVar4;
      iVar5 = piVar11[lVar21 + 1];
      if (iVar4 < iVar5) {
        dVar25 = 0.0;
        lVar24 = lVar22;
        do {
          dVar25 = dVar25 + pdVar9[(pMVar7->AI_).rowidx_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar24]] *
                            (pMVar7->AI_).values_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24];
          lVar24 = lVar24 + 1;
        } while (iVar5 != lVar24);
        pdVar15[lVar21] = (pdVar14[lVar21] - dVar25) * pdVar10[lVar21];
        if (iVar4 < iVar5) {
          piVar12 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            lVar24 = piVar12[lVar22] + lVar23;
            pdVar15[lVar24] = pdVar15[lVar24] - pdVar15[lVar21] * pdVar13[lVar22];
            lVar22 = lVar22 + 1;
          } while (iVar5 != lVar22);
        }
      }
      else {
        pdVar15[lVar21] = pdVar10[lVar21] * pdVar14[lVar21];
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar23);
  }
  operator_delete(local_70._M_data);
  return;
}

Assistant:

void KKTSolverDiag::_Solve(const Vector& a, const Vector& b, double tol,
                            Vector& x, Vector& y, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    assert(factorized_);

    // Compose right-hand side AI*W*a-b.
    Vector rhs = -b;
    for (Int j = 0; j < n+m; j++)
        ScatterColumn(AI, j, W_[j]*a[j], rhs);

    // Solve normal equations.
    y = 0.0;
    normal_matrix_.reset_time();
    precond_.reset_time();
    ConjugateResiduals cr(control_);
    cr.Solve(normal_matrix_, precond_, rhs, tol, &resscale_[0], maxiter_, y);
    info->errflag = cr.errflag();
    info->kktiter1 += cr.iter();
    info->time_cr1 += cr.time();
    info->time_cr1_AAt += normal_matrix_.time();
    info->time_cr1_pre += precond_.time();
    iter_ += cr.iter();

    // Recover solution to KKT system.
    for (Int i = 0; i < m; i++)
        x[n+i] = b[i];
    for (Int j = 0; j < n; j++) {
        double aty = DotColumn(AI, j, y);
        x[j] = W_[j] * (a[j]-aty);
        for (Int p = AI.begin(j); p < AI.end(j); p++) {
            Int i = AI.index(p);
            x[n+i] -= x[j] * AI.value(p);
        }
    }
}